

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningHeuristics.cpp
# Opt level: O3

void __thiscall InliningThreshold::SetHeuristics(InliningThreshold *this)

{
  uint uVar1;
  int iVar2;
  undefined4 uVar3;
  
  iVar2 = DAT_0159eff4;
  this->inlineThreshold = DAT_0159eff4;
  uVar1 = this->nonLoadByteCodeCount;
  if (uVar1 < 0x321) {
    if (uVar1 < 0xc9) {
      if (0x31 < uVar1) goto LAB_0055f3a2;
      iVar2 = iVar2 + DAT_0159f008;
    }
    else {
      iVar2 = iVar2 - DAT_0159f004;
    }
  }
  else {
    iVar2 = iVar2 - DAT_0159f000;
  }
  this->inlineThreshold = iVar2;
LAB_0055f3a2:
  if (this->asmjs == true) {
    this->inlineThreshold = iVar2 + DAT_0159f00c;
  }
  this->constructorInlineThreshold = DAT_015933bc;
  this->outsideLoopInlineThreshold = DAT_015a1ef4;
  uVar3 = (undefined4)_DAT_015a1ec8;
  this->leafInlineThreshold = (int)((ulong)_DAT_015a1ec8 >> 0x20);
  this->loopInlineThreshold = uVar3;
  this->polymorphicInlineThreshold = DAT_015a4da0;
  this->maxNumberOfInlineesWithLoop = DAT_015a1efc;
  this->constantArgumentInlineThreshold = DAT_015a1ed0;
  this->inlineCountMax = (&DAT_0159efe0)[this->forLoopBody];
  return;
}

Assistant:

void InliningThreshold::SetHeuristics()
{
    inlineThreshold = CONFIG_FLAG(InlineThreshold);
    // Inline less aggressively in large functions since the register pressure is likely high.
    // Small functions shouldn't be a problem.
    if (nonLoadByteCodeCount > 800)
    {
        inlineThreshold -= CONFIG_FLAG(InlineThresholdAdjustCountInLargeFunction);
    }
    else if (nonLoadByteCodeCount > 200)
    {
        inlineThreshold -= CONFIG_FLAG(InlineThresholdAdjustCountInMediumSizedFunction);
    }
    else if (nonLoadByteCodeCount < 50)
    {
        inlineThreshold += CONFIG_FLAG(InlineThresholdAdjustCountInSmallFunction);
    }
    if (this->asmjs)
    {
        inlineThreshold += CONFIG_FLAG(AsmJsInlineAdjust);
    }

    constructorInlineThreshold = CONFIG_FLAG(ConstructorInlineThreshold);
    outsideLoopInlineThreshold = CONFIG_FLAG(OutsideLoopInlineThreshold);
    leafInlineThreshold = CONFIG_FLAG(LeafInlineThreshold);
    loopInlineThreshold = CONFIG_FLAG(LoopInlineThreshold);
    polymorphicInlineThreshold = CONFIG_FLAG(PolymorphicInlineThreshold);
    maxNumberOfInlineesWithLoop = CONFIG_FLAG(MaxNumberOfInlineesWithLoop);
    constantArgumentInlineThreshold = CONFIG_FLAG(ConstantArgumentInlineThreshold);
    inlineCountMax = !forLoopBody ? CONFIG_FLAG(InlineCountMax) : CONFIG_FLAG(InlineCountMaxInLoopBodies);
}